

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int nghttp2_http_on_header
              (nghttp2_session *session,nghttp2_stream *stream,nghttp2_frame *frame,
              nghttp2_hd_nv *nv,int trailer)

{
  byte bVar1;
  int iVar2;
  bool local_49;
  ulong uStack_40;
  uint8_t c;
  size_t i;
  int rv;
  int trailer_local;
  nghttp2_hd_nv *nv_local;
  nghttp2_frame *frame_local;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  iVar2 = nghttp2_check_header_name(nv->name->base,nv->name->len);
  if (iVar2 == 0) {
    if ((nv->name->len != 0) && (*nv->name->base == ':')) {
      return -0x213;
    }
    uStack_40 = 0;
    while( true ) {
      if (nv->name->len <= uStack_40) {
        stream->http_flags = stream->http_flags | 0x40;
        return -0x69;
      }
      bVar1 = nv->name->base[uStack_40];
      if ((0x40 < bVar1) && (bVar1 < 0x5b)) break;
      uStack_40 = uStack_40 + 1;
    }
    return -0x213;
  }
  iVar2 = nv->token;
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      i._0_4_ = nghttp2_check_method(nv->value->base,nv->value->len);
      goto LAB_00c51bae;
    }
    if (iVar2 == 3) {
      i._0_4_ = nghttp2_check_path(nv->value->base,nv->value->len);
      goto LAB_00c51bae;
    }
    if (iVar2 == 5) {
      i._0_4_ = check_scheme(nv->value->base,nv->value->len);
      goto LAB_00c51bae;
    }
    if (iVar2 != 0x25) {
      if (((iVar2 == 0x42) && ((stream->flags & 0x40) != 0)) &&
         (iVar2 = lws(nv->value->base,nv->value->len), iVar2 != 0)) {
        i._0_4_ = 0;
      }
      else if ((stream->flags & 0x40) == 0) {
        i._0_4_ = nghttp2_check_header_value_rfc9113(nv->value->base,nv->value->len);
      }
      else {
        i._0_4_ = nghttp2_check_header_value(nv->value->base,nv->value->len);
      }
      goto LAB_00c51bae;
    }
  }
  if ((session->server == '\0') && ((frame->hd).type != '\x05')) {
    if ((stream->flags & 0x40) == 0) {
      i._0_4_ = nghttp2_check_header_value_rfc9113(nv->value->base,nv->value->len);
    }
    else {
      i._0_4_ = nghttp2_check_header_value(nv->value->base,nv->value->len);
    }
  }
  else {
    i._0_4_ = nghttp2_check_authority(nv->value->base,nv->value->len);
  }
LAB_00c51bae:
  if ((int)i == 0) {
    if (nv->name->len == 0) {
      __assert_fail("nv->name->len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_http.c"
                    ,0x1a7,
                    "int nghttp2_http_on_header(nghttp2_session *, nghttp2_stream *, nghttp2_frame *, nghttp2_hd_nv *, int)"
                   );
    }
    if (*nv->name->base == ':') {
      session_local._4_4_ = -0x213;
    }
    else {
      stream->http_flags = stream->http_flags | 0x40;
      session_local._4_4_ = -0x69;
    }
  }
  else if ((session->server == '\0') && ((frame->hd).type != '\x05')) {
    session_local._4_4_ = http_response_on_header(stream,nv,trailer);
  }
  else {
    local_49 = false;
    if (session->server != '\0') {
      local_49 = session->pending_enable_connect_protocol != '\0';
    }
    session_local._4_4_ = http_request_on_header(stream,nv,trailer,(uint)local_49);
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_http_on_header(nghttp2_session *session, nghttp2_stream *stream,
                           nghttp2_frame *frame, nghttp2_hd_nv *nv,
                           int trailer) {
  int rv;

  /* We are strict for pseudo header field.  One bad character should
     lead to fail.  OTOH, we should be a bit forgiving for regular
     headers, since existing public internet has so much illegal
     headers floating around and if we kill the stream because of
     this, we may disrupt many web sites and/or libraries.  So we
     become conservative here, and just ignore those illegal regular
     headers. */
  if (!nghttp2_check_header_name(nv->name->base, nv->name->len)) {
    size_t i;
    if (nv->name->len > 0 && nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* header field name must be lower-cased without exception */
    for (i = 0; i < nv->name->len; ++i) {
      uint8_t c = nv->name->base[i];
      if ('A' <= c && c <= 'Z') {
        return NGHTTP2_ERR_HTTP_HEADER;
      }
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  switch (nv->token) {
  case NGHTTP2_TOKEN__METHOD:
    rv = nghttp2_check_method(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PATH:
    rv = nghttp2_check_path(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__AUTHORITY:
  case NGHTTP2_TOKEN_HOST:
    if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
      rv = nghttp2_check_authority(nv->value->base, nv->value->len);
    } else if (
        stream->flags &
        NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
    break;
  case NGHTTP2_TOKEN__SCHEME:
    rv = check_scheme(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PROTOCOL:
    /* Check the value consists of just white spaces, which was done
       in check_pseudo_header before
       nghttp2_check_header_value_rfc9113 has been introduced. */
    if ((stream->flags &
         NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) &&
        lws(nv->value->base, nv->value->len)) {
      rv = 0;
      break;
    }
    /* fall through */
  default:
    if (stream->flags &
        NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
  }

  if (rv == 0) {
    assert(nv->name->len > 0);
    if (nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    return http_request_on_header(stream, nv, trailer,
                                  session->server &&
                                      session->pending_enable_connect_protocol);
  }

  return http_response_on_header(stream, nv, trailer);
}